

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::dht_get_immutable_item(session_impl *this,sha1_hash *target)

{
  dht_tracker *this_00;
  undefined8 uVar1;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    local_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x30);
    *(code **)local_48._M_unused._0_8_ = get_immutable_callback;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
    uVar1 = *(undefined8 *)((target->m_number)._M_elems + 2);
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x10) =
         *(undefined8 *)(target->m_number)._M_elems;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x18) = uVar1;
    *(uint *)((long)local_48._M_unused._0_8_ + 0x20) = (target->m_number)._M_elems[4];
    *(session_impl **)((long)local_48._M_unused._0_8_ + 0x28) = this;
    pcStack_30 = ::std::
                 _Function_handler<void_(const_libtorrent::dht::item_&),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_libtorrent::digest32<160L>,_std::_Placeholder<1>))(libtorrent::digest32<160L>,_const_libtorrent::dht::item_&)>_>
                 ::_M_invoke;
    local_38 = ::std::
               _Function_handler<void_(const_libtorrent::dht::item_&),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_libtorrent::digest32<160L>,_std::_Placeholder<1>))(libtorrent::digest32<160L>,_const_libtorrent::dht::item_&)>_>
               ::_M_manager;
    libtorrent::dht::dht_tracker::get_item
              (this_00,target,(function<void_(const_libtorrent::dht::item_&)> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  return;
}

Assistant:

ip_filter const& session_impl::get_peer_class_filter() const
	{
		return m_peer_class_filter;
	}